

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svc_datarate_test.cc
# Opt level: O0

void __thiscall
datarate_test::(anonymous_namespace)::DatarateTestSVC_BasicRateTargetingSVC3TL1SLScreen_Test::
~DatarateTestSVC_BasicRateTargetingSVC3TL1SLScreen_Test
          (DatarateTestSVC_BasicRateTargetingSVC3TL1SLScreen_Test *this)

{
  DatarateTestSVC_BasicRateTargetingSVC3TL1SLScreen_Test *in_stack_00000010;
  
  anon_unknown_0::DatarateTestSVC_BasicRateTargetingSVC3TL1SLScreen_Test::
  ~DatarateTestSVC_BasicRateTargetingSVC3TL1SLScreen_Test(in_stack_00000010);
  return;
}

Assistant:

TEST_P(DatarateTestSVC, BasicRateTargetingSVC3TL1SLScreen) {
  BasicRateTargetingSVC3TL1SLScreenTest();
}